

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlTextReaderPtr xmlReaderForMemory(char *buffer,int size,char *URL,char *encoding,int options)

{
  int iVar1;
  xmlParserInputBufferPtr input;
  xmlParserInputBufferPtr buf;
  xmlTextReaderPtr reader;
  int options_local;
  char *encoding_local;
  char *URL_local;
  int size_local;
  char *buffer_local;
  
  input = xmlParserInputBufferCreateMem(buffer,size,XML_CHAR_ENCODING_NONE);
  if (input == (xmlParserInputBufferPtr)0x0) {
    buffer_local = (char *)0x0;
  }
  else {
    buffer_local = (char *)xmlNewTextReader(input,URL);
    if ((xmlTextReaderPtr)buffer_local == (xmlTextReaderPtr)0x0) {
      xmlFreeParserInputBuffer(input);
      buffer_local = (char *)0x0;
    }
    else {
      ((xmlTextReaderPtr)buffer_local)->allocs = ((xmlTextReaderPtr)buffer_local)->allocs | 1;
      iVar1 = xmlTextReaderSetup((xmlTextReaderPtr)buffer_local,(xmlParserInputBufferPtr)0x0,URL,
                                 encoding,options);
      if (iVar1 < 0) {
        xmlFreeTextReader((xmlTextReaderPtr)buffer_local);
        buffer_local = (char *)0x0;
      }
    }
  }
  return (xmlTextReaderPtr)buffer_local;
}

Assistant:

xmlTextReaderPtr
xmlReaderForMemory(const char *buffer, int size, const char *URL,
                   const char *encoding, int options)
{
    xmlTextReaderPtr reader;
    xmlParserInputBufferPtr buf;

    buf = xmlParserInputBufferCreateMem(buffer, size, XML_CHAR_ENCODING_NONE);
    if (buf == NULL) {
        return (NULL);
    }
    reader = xmlNewTextReader(buf, URL);
    if (reader == NULL) {
        xmlFreeParserInputBuffer(buf);
        return (NULL);
    }
    reader->allocs |= XML_TEXTREADER_INPUT;
    if (xmlTextReaderSetup(reader, NULL, URL, encoding, options) < 0) {
        xmlFreeTextReader(reader);
        return (NULL);
    }
    return (reader);
}